

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_status_t flat_file_get(ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value)

{
  byte bVar1;
  char cVar2;
  ion_status_t iVar3;
  undefined1 local_50 [8];
  ion_flat_file_row_t row;
  ion_fpos_t found_loc;
  ion_err_t err;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_flat_file_t *flat_file_local;
  ion_status_t status;
  ion_status_t iVar4;
  ion_status_t iVar5;
  
  row.value = (ion_value_t)0xffffffffffffffff;
  if (flat_file->sorted_mode == '\0') {
    bVar1 = flat_file_scan(flat_file,-1,(ion_fpos_t *)&row.value,(ion_flat_file_row_t *)local_50,
                           '\x01',flat_file_predicate_key_match,key);
    if (bVar1 != 0) {
      if (bVar1 == 0xe) {
        iVar4.error = '\x01';
        iVar4._1_3_ = 0;
        iVar4.count = 0;
        return iVar4;
      }
      flat_file_local = (ion_flat_file_t *)(ulong)bVar1;
      return (ion_status_t)flat_file_local;
    }
  }
  else {
    bVar1 = flat_file_binary_search(flat_file,key,(ion_fpos_t *)&row.value);
    if (bVar1 != 0) {
      flat_file_local = (ion_flat_file_t *)(ulong)bVar1;
      return (ion_status_t)flat_file_local;
    }
    bVar1 = flat_file_read_row(flat_file,(ion_fpos_t)row.value,(ion_flat_file_row_t *)local_50);
    if (bVar1 != 0) {
      flat_file_local = (ion_flat_file_t *)(ulong)bVar1;
      return (ion_status_t)flat_file_local;
    }
    cVar2 = (*(flat_file->super).compare)
                      ((ion_key_t)row._0_8_,key,(flat_file->super).record.key_size);
    if (cVar2 != '\0') {
      iVar5.error = '\x01';
      iVar5._1_3_ = 0;
      iVar5.count = 0;
      return iVar5;
    }
  }
  memcpy(value,row.key,(long)(flat_file->super).record.value_size);
  iVar3.error = '\0';
  iVar3._1_3_ = 0;
  iVar3.count = 1;
  return iVar3;
}

Assistant:

ion_status_t
flat_file_get(
	ion_flat_file_t *flat_file,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_status_t		status		= ION_STATUS_INITIALIZE;
	ion_err_t			err;
	ion_fpos_t			found_loc	= -1;
	ion_flat_file_row_t row;

	if (!flat_file->sorted_mode) {
		err = flat_file_scan(flat_file, -1, &found_loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, key);

		if (err_ok != err) {
			if (err_file_hit_eof == err) {
				/* Alias the error since in this case, since hitting the EOF signifies */
				/* that we didn't find what we were looking for */
				status.error = err_item_not_found;
			}
			else {
				/* This error takes priority since it is likely a file I/O issue */
				status.error = err;
			}

			return status;
		}
	}
	else {
		err = flat_file_binary_search(flat_file, key, &found_loc);

		if (err_ok != err) {
			status.error = err;
			return status;
		}

		err = flat_file_read_row(flat_file, found_loc, &row);

		if (err_ok != err) {
			status.error = err;
			return status;
		}

		if (0 != flat_file->super.compare(row.key, key, flat_file->super.record.key_size)) {
			status.error = err_item_not_found;
			return status;
		}
	}

	memcpy(value, row.value, flat_file->super.record.value_size);
	status.error	= err_ok;
	status.count	= 1;

	return status;
}